

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

bool __thiscall pg::DTLSolver::search(DTLSolver *this,int player)

{
  unsigned_long *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  unsigned_long *puVar5;
  int *piVar6;
  DTLSolver *pDVar7;
  undefined4 vertex;
  bool bVar8;
  long lVar9;
  size_t sVar10;
  size_type sVar11;
  uint *puVar12;
  reference pvVar13;
  ostream *poVar14;
  int iVar15;
  int *piVar16;
  bitset *pbVar17;
  vector<int,_std::allocator<int>_> *pvVar18;
  bitset *pbVar19;
  _label_vertex _Var20;
  int aiStack_2d0 [4];
  undefined8 uStack_2c0;
  int aiStack_2b8 [3];
  bool local_2aa;
  bool local_2a9;
  ostream *local_2a8;
  ostream *local_2a0;
  ostream *local_298;
  ostream *local_290;
  int local_284;
  Game *local_280;
  long local_278;
  long local_270;
  ostream *local_268;
  ostream *local_260;
  ostream *local_258;
  ostream *local_250;
  ostream *local_248;
  int local_23c;
  Game *local_238;
  long local_230;
  long local_228;
  uint local_220;
  bool local_21a;
  undefined1 local_219;
  long local_218;
  long local_210;
  size_t local_208;
  unsigned_long *local_200;
  uint local_1f8;
  undefined1 local_1f1;
  ulong local_1f0;
  unsigned_long *local_1e8;
  bitset *local_1e0;
  uint local_1d8;
  bool local_1d2;
  undefined1 local_1d1;
  long local_1d0;
  long local_1c8;
  int *local_1c0;
  DTLSolver *local_1b8;
  int *local_1b0;
  Game *local_1a8;
  int local_1a0;
  _label_vertex local_198;
  int local_184;
  Game *pGStack_180;
  int v_5;
  int local_178;
  _label_vertex local_170;
  int local_160;
  byte local_159;
  int v_4;
  bool a_change;
  undefined1 local_148 [28];
  int v_3;
  bitset V_1;
  int v_2;
  int s;
  int v_1;
  uint i;
  bitset CurG;
  bitset local_c0;
  int local_9c;
  undefined1 local_98 [4];
  int v;
  bitset V;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int D;
  int T;
  int player_local;
  DTLSolver *this_local;
  char local_21;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  iVar2 = this->tangles;
  iVar3 = this->dominions;
  uStack_2c0 = 0x21f3ce;
  local_1b8 = this;
  lVar9 = Solver::nodecount(&this->super_Solver);
  pDVar7 = local_1b8;
  lVar9 = -(lVar9 * 4 + 0xfU & 0xfffffffffffffff0);
  piVar16 = (int *)((long)aiStack_2b8 + lVar9);
  local_1c0 = piVar16;
  *(undefined8 *)((long)aiStack_2b8 + lVar9 + -8) = 0x21f401;
  V._allocsize = Solver::nodecount(&pDVar7->super_Solver);
  pDVar7 = local_1b8;
  piVar16 = (int *)((long)piVar16 - (V._allocsize * 4 + 0xf & 0xfffffffffffffff0));
  local_1b0 = piVar16;
  if ((local_1b8->super_Solver).trace != 0) {
    piVar16[-2] = 0x21f444;
    piVar16[-1] = 0;
    sVar10 = Solver::nodecount(&pDVar7->super_Solver);
    piVar16[-2] = 0x21f453;
    piVar16[-1] = 0;
    bitset::bitset((bitset *)local_98,sVar10);
    local_9c = 0;
    while( true ) {
      pDVar7 = local_1b8;
      local_1d0 = (long)local_9c;
      piVar16[-2] = 0x21f477;
      piVar16[-1] = 0;
      local_1c8 = Solver::nodecount(&pDVar7->super_Solver);
      pDVar7 = local_1b8;
      piVar6 = local_1c0;
      if (local_1c8 <= local_1d0) break;
      pbVar17 = &local_1b8->G;
      piVar16[-2] = 0x21f4b8;
      piVar16[-1] = 0;
      bitset::operator[](&local_c0,(size_t)pbVar17);
      piVar16[-2] = 0x21f4c6;
      piVar16[-1] = 0;
      local_1d1 = bitset::reference::operator_cast_to_bool((reference *)&local_c0);
      iVar15 = local_9c;
      pDVar7 = local_1b8;
      local_1d2 = false;
      if ((bool)local_1d1) {
        piVar16[-2] = 0x21f4f5;
        piVar16[-1] = 0;
        local_1d8 = Solver::priority(&pDVar7->super_Solver,iVar15);
        local_1d2 = (local_1d8 & 1) == player;
      }
      if (local_1d2 != false) {
        piVar16[-2] = 0x21f538;
        piVar16[-1] = 0;
        bitset::operator[]((bitset *)&CurG._allocsize,(size_t)local_98);
        piVar16[-2] = 0x21f54b;
        piVar16[-1] = 0;
        bitset::reference::operator=((reference *)&CurG._allocsize,true);
      }
      local_9c = local_9c + 1;
    }
    pbVar17 = &local_1b8->G;
    piVar16[-2] = 0x21f5b3;
    piVar16[-1] = 0;
    computeDistanceValues(pDVar7,(bitset *)local_98,pbVar17,pbVar17,piVar6,player);
    piVar16[-2] = 0x21f5c1;
    piVar16[-1] = 0;
    bitset::~bitset((bitset *)local_98);
  }
  pbVar17 = &local_1b8->G;
  local_1e0 = (bitset *)&v_1;
  piVar16[-2] = 0x21f5e2;
  piVar16[-1] = 0;
  bitset::bitset((bitset *)&v_1,pbVar17);
  pDVar7 = local_1b8;
  pbVar17 = local_1e0;
  piVar16[-2] = 0x21f5fa;
  piVar16[-1] = 0;
  search_rec(pDVar7,pbVar17,player,0);
  pbVar17 = &local_1b8->W;
  local_1e8 = pbVar17->_bits;
  local_10 = pbVar17;
  piVar16[-2] = 0x21f620;
  piVar16[-1] = 0;
  sVar10 = bitset::num_blocks(pbVar17);
  puVar5 = local_1e8;
  puVar1 = local_1e8 + sVar10;
  local_11 = '\0';
  piVar16[-2] = 0x21f638;
  piVar16[-1] = 0;
  std::fill<unsigned_long*,char>(puVar5,puVar1,&local_11);
  pvVar18 = &local_1b8->dom_vector;
  piVar16[-2] = 0x21f64f;
  piVar16[-1] = 0;
  bVar8 = std::vector<int,_std::allocator<int>_>::empty(pvVar18);
  if (!bVar8) {
    s = 0;
    while( true ) {
      local_1f0 = (ulong)(uint)s;
      pvVar18 = &local_1b8->dom_vector;
      piVar16[-2] = 0x21f681;
      piVar16[-1] = 0;
      sVar11 = std::vector<int,_std::allocator<int>_>::size(pvVar18);
      if (sVar11 <= local_1f0) break;
      pvVar18 = &local_1b8->dom_vector;
      piVar16[-2] = 0x21f6af;
      piVar16[-1] = 0;
      puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar18,(ulong)(uint)s);
      uVar4 = *puVar12;
      pvVar18 = &local_1b8->dom_vector;
      piVar16[-2] = 0x21f6d7;
      piVar16[-1] = 0;
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar18,(ulong)(s + 1));
      local_1b8->str[(int)uVar4] = *pvVar13;
      iVar15 = (local_1b8->Q).pointer;
      (local_1b8->Q).pointer = iVar15 + 1;
      (local_1b8->Q).queue[iVar15] = uVar4;
      s = s + 2;
    }
    pvVar18 = &local_1b8->dom_vector;
    piVar16[-2] = 0x21f76c;
    piVar16[-1] = 0;
    std::vector<int,_std::allocator<int>_>::clear(pvVar18);
    while (pDVar7 = local_1b8, local_1f1 = (local_1b8->Q).pointer != 0, (bool)local_1f1) {
      iVar15 = (local_1b8->Q).pointer + -1;
      (local_1b8->Q).pointer = iVar15;
      uVar4 = (local_1b8->Q).queue[iVar15];
      iVar15 = local_1b8->str[(int)uVar4];
      local_1f8 = uVar4;
      piVar16[-2] = 0x21f7f8;
      piVar16[-1] = 0;
      Solver::solve(&pDVar7->super_Solver,uVar4,player,iVar15);
      pbVar17 = &local_1b8->G;
      piVar16[-2] = 0x21f81b;
      piVar16[-1] = 0;
      bitset::operator[]((bitset *)&V_1._allocsize,(size_t)pbVar17);
      piVar16[-2] = 0x21f82b;
      piVar16[-1] = 0;
      bitset::reference::operator=((reference *)&V_1._allocsize,false);
      pDVar7 = local_1b8;
      pbVar19 = &local_1b8->G;
      pbVar17 = &local_1b8->S;
      piVar16[-4] = 0xffffffff;
      piVar16[-6] = 0x21f866;
      piVar16[-5] = 0;
      attractVertices(pDVar7,player,uVar4,pbVar19,pbVar17,pbVar19,piVar16[-4]);
      pDVar7 = local_1b8;
      pbVar19 = &local_1b8->G;
      pbVar17 = &local_1b8->S;
      piVar16[-4] = 0xffffffff;
      piVar16[-6] = 0x21f8a5;
      piVar16[-5] = 0;
      attractTangles(pDVar7,player,uVar4,pbVar19,pbVar17,pbVar19,piVar16[-4]);
    }
    pbVar17 = &local_1b8->S;
    local_200 = pbVar17->_bits;
    local_20 = pbVar17;
    piVar16[-2] = 0x21f8d4;
    piVar16[-1] = 0;
    sVar10 = bitset::num_blocks(pbVar17);
    puVar5 = local_200;
    puVar1 = local_200 + sVar10;
    local_21 = '\0';
    piVar16[-2] = 0x21f8ec;
    piVar16[-1] = 0;
    std::fill<unsigned_long*,char>(puVar5,puVar1,&local_21);
  }
  pDVar7 = local_1b8;
  if (((2 < (local_1b8->super_Solver).trace) && (local_1b8->tangles != iVar2)) &&
     (local_1b8->dominions == iVar3)) {
    piVar16[-2] = 0x21f935;
    piVar16[-1] = 0;
    sVar10 = Solver::nodecount(&pDVar7->super_Solver);
    local_208 = sVar10;
    piVar16[-2] = 0x21f951;
    piVar16[-1] = 0;
    bitset::bitset((bitset *)(local_148 + 0x18),sVar10);
    local_148._20_4_ = 0;
    while( true ) {
      pDVar7 = local_1b8;
      local_218 = (long)(int)local_148._20_4_;
      piVar16[-2] = 0x21f977;
      piVar16[-1] = 0;
      local_210 = Solver::nodecount(&pDVar7->super_Solver);
      piVar6 = local_1b0;
      pDVar7 = local_1b8;
      if (local_210 <= local_218) break;
      pbVar17 = &local_1b8->G;
      piVar16[-2] = 0x21f9b8;
      piVar16[-1] = 0;
      bitset::operator[]((bitset *)local_148,(size_t)pbVar17);
      piVar16[-2] = 0x21f9c6;
      piVar16[-1] = 0;
      local_219 = bitset::reference::operator_cast_to_bool((reference *)local_148);
      vertex = local_148._20_4_;
      pDVar7 = local_1b8;
      local_21a = false;
      if ((bool)local_219) {
        piVar16[-2] = 0x21f9f5;
        piVar16[-1] = 0;
        local_220 = Solver::priority(&pDVar7->super_Solver,vertex);
        local_21a = (local_220 & 1) == player;
      }
      if (local_21a != false) {
        piVar16[-2] = 0x21fa38;
        piVar16[-1] = 0;
        bitset::operator[]((bitset *)&v_4,(size_t)(local_148 + 0x18));
        piVar16[-2] = 0x21fa4b;
        piVar16[-1] = 0;
        bitset::reference::operator=((reference *)&v_4,true);
      }
      local_148._20_4_ = local_148._20_4_ + 1;
    }
    pbVar17 = &local_1b8->G;
    piVar16[-2] = 0x21fab3;
    piVar16[-1] = 0;
    computeDistanceValues(pDVar7,(bitset *)(local_148 + 0x18),pbVar17,pbVar17,piVar6,player);
    local_159 = 0;
    local_160 = 0;
    while( true ) {
      pDVar7 = local_1b8;
      local_230 = (long)local_160;
      piVar16[-2] = 0x21fae0;
      piVar16[-1] = 0;
      local_228 = Solver::nodecount(&pDVar7->super_Solver);
      iVar15 = local_160;
      pDVar7 = local_1b8;
      if (local_228 <= local_230) break;
      if (local_1c0[local_160] != local_1b0[local_160]) {
        local_248 = (local_1b8->super_Solver).logger;
        piVar16[-2] = 0x21fb45;
        piVar16[-1] = 0;
        _Var20 = Solver::label_vertex(&pDVar7->super_Solver,iVar15);
        poVar14 = local_248;
        local_238 = _Var20.g;
        local_23c = _Var20.v;
        pGStack_180 = local_238;
        local_178 = local_23c;
        local_170.g = local_238;
        local_170.v = local_23c;
        piVar16[-2] = 0x21fb9b;
        piVar16[-1] = 0;
        poVar14 = operator<<(poVar14,&local_170);
        local_250 = poVar14;
        piVar16[-2] = 0x21fbb7;
        piVar16[-1] = 0;
        poVar14 = std::operator<<(poVar14,": ");
        iVar15 = local_1c0[local_160];
        local_258 = poVar14;
        piVar16[-2] = 0x21fbdd;
        piVar16[-1] = 0;
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar15);
        local_260 = poVar14;
        piVar16[-2] = 0x21fbf9;
        piVar16[-1] = 0;
        std::operator<<(poVar14," => ");
        if (local_1b0[local_160] == 0x7fffffff) {
          poVar14 = (local_1b8->super_Solver).logger;
          piVar16[-2] = 0x21fc29;
          piVar16[-1] = 0;
          std::operator<<(poVar14,"MAX\n");
        }
        else {
          poVar14 = (local_1b8->super_Solver).logger;
          iVar15 = local_1b0[local_160];
          piVar16[-2] = 0x21fc4e;
          piVar16[-1] = 0;
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar15);
          local_268 = poVar14;
          piVar16[-2] = 0x21fc6a;
          piVar16[-1] = 0;
          std::operator<<(poVar14,"\n");
        }
        local_159 = 1;
      }
      local_160 = local_160 + 1;
    }
    if ((local_159 & 1) == 0) {
      local_184 = 0;
      while( true ) {
        pDVar7 = local_1b8;
        local_278 = (long)local_184;
        piVar16[-2] = 0x21fcbc;
        piVar16[-1] = 0;
        local_270 = Solver::nodecount(&pDVar7->super_Solver);
        iVar15 = local_184;
        pDVar7 = local_1b8;
        if (local_270 <= local_278) break;
        local_290 = (local_1b8->super_Solver).logger;
        piVar16[-2] = 0x21fcf9;
        piVar16[-1] = 0;
        _Var20 = Solver::label_vertex(&pDVar7->super_Solver,iVar15);
        poVar14 = local_290;
        local_280 = _Var20.g;
        local_284 = _Var20.v;
        local_1a8 = local_280;
        local_1a0 = local_284;
        local_198.g = local_280;
        local_198.v = local_284;
        piVar16[-2] = 0x21fd4f;
        piVar16[-1] = 0;
        poVar14 = operator<<(poVar14,&local_198);
        local_298 = poVar14;
        piVar16[-2] = 0x21fd6b;
        piVar16[-1] = 0;
        poVar14 = std::operator<<(poVar14,": ");
        iVar15 = local_1c0[local_184];
        local_2a0 = poVar14;
        piVar16[-2] = 0x21fd91;
        piVar16[-1] = 0;
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar15);
        local_2a8 = poVar14;
        piVar16[-2] = 0x21fdad;
        piVar16[-1] = 0;
        std::operator<<(poVar14,"\n");
        local_184 = local_184 + 1;
      }
      poVar14 = (local_1b8->super_Solver).logger;
      piVar16[-2] = 0x21fddc;
      piVar16[-1] = 0;
      std::operator<<(poVar14,"nothing changed!\n");
    }
    piVar16[-2] = 0x21fdec;
    piVar16[-1] = 0;
    bitset::~bitset((bitset *)(local_148 + 0x18));
  }
  local_2a9 = true;
  if (local_1b8->tangles == iVar2) {
    local_2a9 = local_1b8->dominions != iVar3;
  }
  local_2aa = local_2a9;
  piVar16[-2] = 0x21fe33;
  piVar16[-1] = 0;
  bitset::~bitset((bitset *)&v_1);
  return (bool)(local_2aa & 1);
}

Assistant:

bool
DTLSolver::search(const int player)
{
    const int T = tangles;
    const int D = dominions;

#ifndef NDEBUG
    int val1[nodecount()], val2[nodecount()];
    if (trace) {
        bitset V(nodecount()); // the current V
        for (int v=0; v<nodecount(); v++) {
            if (G[v] and (priority(v)&1) == player) V[v] = true;
        }
        computeDistanceValues(V, G, G, val1, player);
    }
#endif

    bitset CurG(G);
    search_rec(CurG, player, 0);
    W.reset();

    /**
     * Extend any dominions that were found.
     * (Any solved vertices are now in <SQ>.)
     */

    if (!dom_vector.empty()) {
        for (unsigned i = 0; i<dom_vector.size(); i+=2) {
            int v = dom_vector[i];
            int s = dom_vector[i+1];
            str[v] = s;
            Q.push(v);
        }
        dom_vector.clear();

        while (Q.nonempty()) {
            const int v = Q.pop();
            Solver::solve(v, player, str[v]);
            G[v] = false; // remove from Game
            attractVertices(player, v, G, S, G, -1);
            attractTangles(player, v, G, S, G, -1);
        }
        S.reset();
    }

#ifndef NDEBUG
    if (trace >= 3) {
        if (tangles != T and dominions == D) {
            bitset V(nodecount()); // the current V
            for (int v=0; v<nodecount(); v++) {
                if (G[v] and (priority(v)&1) == player) V[v] = true;
            }
            computeDistanceValues(V, G, G, val2, player);
            bool a_change = false;
            for (int v=0; v<nodecount(); v++) {
                if (val1[v] != val2[v]) {
                    logger << label_vertex(v) << ": " << val1[v] << " => ";
                    if (val2[v] == INT_MAX)  logger << "MAX\n";
                    else logger << val2[v] << "\n";
                    a_change = true;
                }
            }
            if (!a_change) {
                for (int v=0; v<nodecount(); v++) logger << label_vertex(v) << ": " << val1[v] << "\n";
                logger << "nothing changed!\n";
                // throw "nothing changed!";
            }
        }
    }
#endif

    return tangles != T or dominions != D;
}